

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O3

int pk_get_ecpubkey(uchar **p,uchar *end,mbedtls_pk_context *pk)

{
  int iVar1;
  
  iVar1 = mbedtls_ecp_point_read_binary
                    ((mbedtls_ecp_group *)pk,(mbedtls_ecp_point *)&pk[8].priv_id,*p,
                     (long)end - (long)*p);
  if (iVar1 == 0) {
    iVar1 = mbedtls_ecp_check_pubkey((mbedtls_ecp_group *)pk,(mbedtls_ecp_point *)&pk[8].priv_id);
  }
  *p = end;
  return iVar1;
}

Assistant:

static int pk_get_ecpubkey(unsigned char **p, const unsigned char *end,
                           mbedtls_pk_context *pk)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_PK_USE_PSA_EC_DATA)
    mbedtls_svc_key_id_t key;
    psa_key_attributes_t key_attrs = PSA_KEY_ATTRIBUTES_INIT;
    size_t len = (end - *p);

    if (len > PSA_EXPORT_PUBLIC_KEY_MAX_SIZE) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    /* Compressed point format are not supported yet by PSA crypto. As a
     * consequence ecp functions are used to "convert" the point to
     * uncompressed format */
    if ((**p == 0x02) || (**p == 0x03)) {
#if defined(MBEDTLS_PK_PARSE_EC_COMPRESSED)
        ret = pk_convert_compressed_ec(pk, *p, len,
                                       &(pk->pub_raw_len), pk->pub_raw,
                                       PSA_EXPORT_PUBLIC_KEY_MAX_SIZE);
        if (ret != 0) {
            return ret;
        }
#else /* MBEDTLS_PK_PARSE_EC_COMPRESSED */
        return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
#endif /* MBEDTLS_PK_PARSE_EC_COMPRESSED */
    } else {
        /* Uncompressed format */
        if ((size_t) (end - *p) > MBEDTLS_PK_MAX_EC_PUBKEY_RAW_LEN) {
            return MBEDTLS_ERR_PK_BUFFER_TOO_SMALL;
        }
        memcpy(pk->pub_raw, *p, (end - *p));
        pk->pub_raw_len = end - *p;
    }

    /* Validate the key by trying to importing it */
    psa_set_key_usage_flags(&key_attrs, 0);
    psa_set_key_algorithm(&key_attrs, PSA_ALG_ECDSA_ANY);
    psa_set_key_type(&key_attrs, PSA_KEY_TYPE_ECC_PUBLIC_KEY(pk->ec_family));
    psa_set_key_bits(&key_attrs, pk->ec_bits);

    if ((psa_import_key(&key_attrs, pk->pub_raw, pk->pub_raw_len,
                        &key) != PSA_SUCCESS) ||
        (psa_destroy_key(key) != PSA_SUCCESS)) {
        mbedtls_platform_zeroize(pk->pub_raw, MBEDTLS_PK_MAX_EC_PUBKEY_RAW_LEN);
        pk->pub_raw_len = 0;
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }
    ret = 0;
#else /* MBEDTLS_PK_USE_PSA_EC_DATA */
    mbedtls_ecp_keypair *ec_key = (mbedtls_ecp_keypair *) pk->pk_ctx;
    if ((ret = mbedtls_ecp_point_read_binary(&ec_key->grp, &ec_key->Q,
                                             (const unsigned char *) *p,
                                             end - *p)) == 0) {
        ret = mbedtls_ecp_check_pubkey(&ec_key->grp, &ec_key->Q);
    }
#endif /* MBEDTLS_PK_USE_PSA_EC_DATA */

    /*
     * We know mbedtls_ecp_point_read_binary consumed all bytes or failed
     */
    *p = (unsigned char *) end;

    return ret;
}